

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::CommitScissorRects(DeviceContextVkImpl *this)

{
  undefined8 uVar1;
  PipelineStateVkImpl *this_00;
  undefined8 uVar2;
  GraphicsPipelineDesc *pGVar3;
  ulong uVar4;
  long lVar5;
  VkRect2D VkScissorRects [16];
  string local_118 [8];
  
  this_00 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState.m_pObject;
  if (this_00 != (PipelineStateVkImpl *)0x0) {
    pGVar3 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetGraphicsPipelineDesc
                       (&this_00->super_PipelineStateBase<Diligent::EngineVkImplTraits>);
    if ((pGVar3->RasterizerDesc).ScissorEnable != false) goto LAB_001b5a19;
  }
  FormatString<char[54]>
            (local_118,(char (*) [54])"Scissor test must be enabled in the graphics pipeline");
  DebugAssertionFailed
            (local_118[0]._M_dataplus._M_p,"CommitScissorRects",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
             ,0x6d6);
  std::__cxx11::string::~string((string *)local_118);
LAB_001b5a19:
  uVar4 = (ulong)(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                 super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects;
  if (uVar4 != 0) {
    for (lVar5 = 0; uVar4 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
      uVar2 = *(undefined8 *)
               ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScissorRects[0].left
               + lVar5);
      *(undefined8 *)((long)&local_118[0]._M_dataplus._M_p + lVar5) = uVar2;
      uVar1 = *(undefined8 *)
               ((long)&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScissorRects[0].right
               + lVar5);
      *(ulong *)((long)&local_118[0]._M_string_length + lVar5) =
           CONCAT44((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20),
                    (int)uVar1 - (int)uVar2);
    }
    EnsureVkCmdBuffer(this);
    VulkanUtilities::VulkanCommandBuffer::SetScissorRects
              (&this->m_CommandBuffer,0,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumScissorRects,
               (VkRect2D *)local_118);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::CommitScissorRects()
{
    VERIFY(m_pPipelineState && m_pPipelineState->GetGraphicsPipelineDesc().RasterizerDesc.ScissorEnable, "Scissor test must be enabled in the graphics pipeline");

    if (m_NumScissorRects == 0)
        return; // Scissors have not been set in the context yet

    VkRect2D VkScissorRects[MAX_VIEWPORTS]; // Do not waste time initializing array with zeroes
    for (Uint32 sr = 0; sr < m_NumScissorRects; ++sr)
    {
        const Rect& SrcRect       = m_ScissorRects[sr];
        VkScissorRects[sr].offset = {SrcRect.left, SrcRect.top};
        VkScissorRects[sr].extent = {static_cast<uint32_t>(SrcRect.right - SrcRect.left), static_cast<uint32_t>(SrcRect.bottom - SrcRect.top)};
    }

    EnsureVkCmdBuffer();
    // TODO: reinterpret_cast m_Viewports to m_Viewports?
    m_CommandBuffer.SetScissorRects(0, m_NumScissorRects, VkScissorRects);
}